

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void fail_if_blocks_allocated(ListNode *check_point,char *test_name)

{
  undefined8 *result;
  void **ppvVar1;
  ListNode *pLVar2;
  ListNode *pLVar3;
  int quit_application;
  ListNode **ppLVar4;
  long lVar5;
  
  pLVar2 = get_allocated_blocks_list();
  _assert_true((unsigned_long)check_point,"check_point",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x851);
  _assert_true((unsigned_long)check_point->next,"check_point->next",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x852);
  lVar5 = 0;
  ppLVar4 = &check_point->next;
  while (pLVar3 = *ppLVar4, pLVar3 != pLVar2) {
    result = (undefined8 *)pLVar3->value;
    _assert_true((unsigned_long)result,"block_info.ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
                 ,0x858);
    if (lVar5 == 0) {
      cm_print_error("Blocks allocated...\n");
    }
    cm_print_error("%s:%u: note: block %p allocated here\n",result[3],(ulong)*(uint *)(result + 4),
                   *result);
    lVar5 = lVar5 + 1;
    ppLVar4 = &pLVar3->next;
  }
  if (lVar5 == 0) {
    return;
  }
  pLVar3 = get_allocated_blocks_list();
  _assert_true((unsigned_long)check_point,"check_point",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x86b);
  pLVar2 = check_point->next;
  _assert_true((unsigned_long)pLVar2,"node",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x86e);
  while (pLVar2 != pLVar3) {
    ppvVar1 = &pLVar2->value;
    pLVar2 = pLVar2->next;
    _test_free((void *)((long)*ppvVar1 + 0x58),
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x877);
  }
  quit_application = 0x106c72;
  cm_print_error("ERROR: %s leaked %zu block(s)\n",test_name,lVar5);
  exit_test(quit_application);
}

Assistant:

static void fail_if_blocks_allocated(const ListNode * const check_point,
                                     const char * const test_name) {
    const size_t allocated_blocks = display_allocated_blocks(check_point);
    if (allocated_blocks > 0) {
        free_allocated_blocks(check_point);
        cm_print_error("ERROR: %s leaked %zu block(s)\n", test_name,
                       allocated_blocks);
        exit_test(1);
    }
}